

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O2

XMLNode __thiscall
XMLParser::XMLNode::parseString(XMLNode *this,char *lpszXML,char *tag,XMLResults *pResults)

{
  undefined *puVar1;
  XMLNode XVar2;
  int iVar3;
  int iVar4;
  XMLError XVar5;
  XMLError XVar6;
  char *__s1;
  int iVar7;
  int iVar8;
  long lVar9;
  XMLNode xnode;
  XMLNode local_78;
  XML xml;
  
  if (lpszXML == (char *)0x0) {
    if (pResults != (XMLResults *)0x0) {
      pResults->error = eXMLErrorNoElements;
      pResults->nLine = 0;
      pResults->nColumn = 0;
    }
    XMLNode(this,(XMLNode *)&emptyXMLNode);
    return (XMLNode)(XMLNodeData *)this;
  }
  XMLNode(&xnode,(XMLNodeData *)0x0,(char *)0x0,'\0');
  xml.nIndex = 0;
  xml.nIndexMissigEndTag = 0;
  xml.error = eXMLErrorNone;
  xml.lpEndTag = (char *)0x0;
  xml.cbEndTag = 0;
  xml.lpNewElement = (char *)0x0;
  xml.cbNewElement = 0;
  xml.nFirst = 1;
  xml.lpXML = lpszXML;
  xml.lpszText = lpszXML;
  ParseXMLElement(&xnode,&xml);
  XVar6 = xml.error;
  XVar2 = xnode;
  if (xnode.d == (XMLNodeData *)0x0) {
    XVar6 = eXMLErrorNoXMLTagFound;
LAB_0017a8fb:
    __s1 = (char *)0x0;
LAB_0017a8fd:
    if (((tag != (char *)0x0) && (*tag != '\0')) &&
       ((__s1 == (char *)0x0 || (iVar3 = strcasecmp(__s1,tag), iVar3 != 0)))) {
      getChildNode(&local_78,(char *)&xnode,(int *)tag);
      operator=(&xnode,&local_78);
      ~XMLNode(&local_78);
      if (xnode.d == (XMLNodeData *)0x0) {
        if (pResults != (XMLResults *)0x0) {
          pResults->error = eXMLErrorFirstTagNotFound;
          pResults->nLine = 0;
          pResults->nColumn = 0;
        }
        XMLNode(this,(XMLNode *)&emptyXMLNode);
        goto LAB_0017aa0d;
      }
    }
  }
  else {
    XVar5 = eXMLErrorNoXMLTagFound;
    if ((xnode.d)->nChild != 0) {
      XVar5 = xml.error;
    }
    if (((xnode.d)->nChild == 1) && (iVar3 = nElement(&xnode), iVar3 == 1)) {
      XMLNode(&local_78,(XVar2.d)->pChild);
      operator=(&xnode,&local_78);
      ~XMLNode(&local_78);
    }
    if (XVar5 < eXMLErrorEmpty) {
      XVar6 = XVar5;
      if (xnode.d == (XMLNodeData *)0x0) goto LAB_0017a8fb;
      __s1 = (xnode.d)->lpszName;
      goto LAB_0017a8fd;
    }
    operator=(&xnode,(XMLNode *)&emptyXMLNode);
  }
  if ((pResults != (XMLResults *)0x0) && (pResults->error = XVar6, XVar6 != eXMLErrorNone)) {
    if (XVar6 == eXMLErrorMissingEndTag) {
      xml.nIndex = xml.nIndexMissigEndTag;
      iVar3 = xml.nIndexMissigEndTag;
    }
    else {
      iVar3 = xml.nIndex;
    }
    if (xml.lpXML == (char *)0x0) {
      __assert_fail("lpXML",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/build_O2/_deps/xmlparser-src/src/xmlParser.cpp"
                    ,0x997,"void XMLParser::CountLinesAndColumns(const char *, int, XMLResults *)");
    }
    pResults->nLine = 1;
    puVar1 = XML_ByteTable;
    iVar4 = 0;
    iVar7 = 1;
    do {
      iVar8 = 1;
      while( true ) {
        pResults->nColumn = iVar8;
        if (iVar3 <= iVar4) goto LAB_0017aa00;
        lVar9 = (long)iVar4;
        iVar4 = iVar4 + (char)puVar1[(byte)xml.lpXML[lVar9]];
        if ((ulong)(byte)xml.lpXML[lVar9] == 10) break;
        iVar8 = iVar8 + 1;
      }
      iVar7 = iVar7 + 1;
      pResults->nLine = iVar7;
    } while( true );
  }
LAB_0017aa00:
  XMLNode(this,&xnode);
LAB_0017aa0d:
  ~XMLNode(&xnode);
  return (XMLNode)(XMLNodeData *)this;
}

Assistant:

XMLNode XMLNode::parseString(XMLCSTR lpszXML, XMLCSTR tag, XMLResults * pResults)
    {
        if(!lpszXML)
        {
            if(pResults)
            {
                pResults->error = eXMLErrorNoElements;
                pResults->nLine = 0;
                pResults->nColumn = 0;
            }
            return emptyXMLNode;
        }

        XMLNode xnode(NULL, NULL, FALSE);
        struct XML xml = {lpszXML, lpszXML, 0, 0, eXMLErrorNone, NULL, 0, NULL, 0, TRUE};

        // Create header element
        xnode.ParseXMLElement(&xml);
        enum XMLError error = xml.error;
        if(!xnode.nChildNode())
            error = eXMLErrorNoXMLTagFound;
        if((xnode.nChildNode() == 1) && (xnode.nElement() == 1))
            xnode = xnode.getChildNode();   // skip the empty node

        // If no error occurred
        if((error == eXMLErrorNone) || (error == eXMLErrorMissingEndTag)
           || (error == eXMLErrorNoXMLTagFound))
        {
            XMLCSTR name = xnode.getName();
            if(tag && (*tag) && ((!name) || (xstricmp(name, tag))))
            {
                xnode = xnode.getChildNode(tag);
                if(xnode.isEmpty())
                {
                    if(pResults)
                    {
                        pResults->error = eXMLErrorFirstTagNotFound;
                        pResults->nLine = 0;
                        pResults->nColumn = 0;
                    }
                    return emptyXMLNode;
                }
            }
        }
        else
        {
            // Cleanup: this will destroy all the nodes
            xnode = emptyXMLNode;
        }


        // If we have been given somewhere to place results
        if(pResults)
        {
            pResults->error = error;

            // If we have an error
            if(error != eXMLErrorNone)
            {
                if(error == eXMLErrorMissingEndTag)
                    xml.nIndex = xml.nIndexMissigEndTag;
                // Find which line and column it starts on.
                CountLinesAndColumns(xml.lpXML, xml.nIndex, pResults);
            }
        }
        return xnode;
    }